

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O1

int test_ipcmsg_resultsummary(ITesting *t)

{
  bool bVar1;
  kTRContinueMode kVar2;
  int iVar3;
  IPCResultSummary resultSummaryOut;
  UTest_IPC_VectorWriter vectorWriter;
  IPCResultSummary resultSummaryIn;
  IPCBufferedWriter bufferedWriter;
  IPCBinaryDecoder decoder;
  IPCBinaryEncoder encoder;
  UTest_IPC_VectorReader vectorReader;
  IPCResultSummary local_120;
  IPCWriter local_e8;
  void *local_e0;
  void *pvStack_d8;
  long local_d0;
  undefined **local_c8;
  IPCDeserializer local_c0;
  undefined8 local_b8;
  double dStack_b0;
  void *local_a8;
  undefined8 uStack_a0;
  long local_98;
  IPCBufferedWriter local_90;
  IPCBinaryDecoder local_68;
  IPCEncoderBase local_50;
  IPCBufferedWriter *local_48;
  IPCReader local_40;
  undefined8 local_38;
  void **local_30;
  
  local_120.super_IPCSerializer._vptr_IPCSerializer = (_func_int **)&PTR__IPCResultSummary_00227130;
  local_120.super_IPCDeserializer.super_IPCObject._vptr_IPCObject =
       (IPCObject)&PTR__IPCResultSummary_00227168;
  local_120.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.testsExecuted = 1;
  local_120.testsFailed = 2;
  local_120.durationSec = 3.0;
  local_e8._vptr_IPCWriter = (_func_int **)&PTR_Write_002268f8;
  local_e0 = (void *)0x0;
  pvStack_d8 = (void *)0x0;
  local_d0 = 0;
  gnilk::IPCBufferedWriter::IPCBufferedWriter(&local_90,&local_e8);
  local_50.super_IPCWriter._vptr_IPCWriter = (IPCWriter)&PTR_Write_00226f18;
  local_48 = &local_90;
  bVar1 = gnilk::IPCResultSummary::Marshal(&local_120,&local_50);
  if (!bVar1) {
    kVar2 = (*t->AssertError)(0x23,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"resultSummaryOut.Marshal(encoder)");
    if (kVar2 != kTRLeave) goto LAB_00166aca;
LAB_00166c59:
    iVar3 = 0x10;
    goto LAB_00166c5e;
  }
LAB_00166aca:
  gnilk::IPCBufferedWriter::Flush(&local_90);
  if (local_e0 == pvStack_d8) {
    kVar2 = (*t->AssertError)(0x27,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"!vectorWriter.Data().empty()");
    if (kVar2 == kTRLeave) goto LAB_00166c59;
  }
  local_30 = &local_e0;
  local_68.reader = &local_40;
  local_40._vptr_IPCReader = (_func_int **)&PTR_Read_00226948;
  local_38 = 0;
  local_68.deserializer = &local_c0;
  local_c8 = &PTR__IPCResultSummary_00227130;
  local_c0.super_IPCObject._vptr_IPCObject = (IPCObject)&PTR__IPCResultSummary_00227168;
  local_b8 = 0;
  dStack_b0 = 0.0;
  local_a8 = (void *)0x0;
  uStack_a0 = 0;
  local_98 = 0;
  local_68.super_IPCDecoderBase.super_IPCReader._vptr_IPCReader = (IPCReader)&PTR_Read_00226e48;
  bVar1 = gnilk::IPCBinaryDecoder::Process(&local_68);
  if (bVar1) {
LAB_00166b89:
    iVar3 = (*(local_68.reader)->_vptr_IPCReader[1])();
    if ((char)iVar3 != '\0') {
      kVar2 = (*t->AssertError)(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"decoder.Available() == false");
      if (kVar2 == kTRLeave) goto LAB_00166c2b;
    }
    if ((int)local_b8 != local_120.testsExecuted) {
      kVar2 = (*t->AssertError)(0x33,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted");
      if (kVar2 == kTRLeave) goto LAB_00166c2b;
    }
    if (local_b8._4_4_ != local_120.testsFailed) {
      kVar2 = (*t->AssertError)(0x34,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"resultSummaryIn.testsFailed == resultSummaryOut.testsFailed");
      if (kVar2 == kTRLeave) goto LAB_00166c2b;
    }
    if ((dStack_b0 != local_120.durationSec) || (NAN(dStack_b0) || NAN(local_120.durationSec))) {
      kVar2 = (*t->AssertError)(0x35,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"resultSummaryIn.durationSec == resultSummaryOut.durationSec");
      if (kVar2 == kTRLeave) goto LAB_00166c2b;
    }
    iVar3 = 0;
  }
  else {
    kVar2 = (*t->AssertError)(0x2f,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"decoder.Process()");
    if (kVar2 != kTRLeave) goto LAB_00166b89;
LAB_00166c2b:
    iVar3 = 0x10;
  }
  local_c8 = &PTR__IPCResultSummary_00227130;
  local_c0.super_IPCObject._vptr_IPCObject = (IPCObject)&PTR__IPCResultSummary_00227168;
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
LAB_00166c5e:
  local_90.super_IPCWriter._vptr_IPCWriter = (_func_int **)&PTR_Write_00226e08;
  if (local_90.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_e8._vptr_IPCWriter = (_func_int **)&PTR_Write_002268f8;
  if (local_e0 != (void *)0x0) {
    operator_delete(local_e0,local_d0 - (long)local_e0);
  }
  local_120.super_IPCSerializer._vptr_IPCSerializer = (_func_int **)&PTR__IPCResultSummary_00227130;
  local_120.super_IPCDeserializer.super_IPCObject._vptr_IPCObject =
       (IPCObject)&PTR__IPCResultSummary_00227168;
  if (local_120.testResults.
      super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.testResults.
                    super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.testResults.
                          super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.testResults.
                          super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

DLL_EXPORT int test_ipcmsg_resultsummary(ITesting *t) {
    gnilk::IPCResultSummary resultSummaryOut;
    resultSummaryOut.testsExecuted = 1;
    resultSummaryOut.testsFailed = 2;
    resultSummaryOut.durationSec = 3.0;

    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, resultSummaryOut.Marshal(encoder));

    // Flush data - this will do the actual writing to the underlying writer
    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCResultSummary resultSummaryIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, resultSummaryIn);

    // Deserialize
    TR_ASSERT(t, decoder.Process());
    TR_ASSERT(t, decoder.Available() == false);

    // Make sure we have everything
    TR_ASSERT(t, resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted);
    TR_ASSERT(t, resultSummaryIn.testsFailed == resultSummaryOut.testsFailed);
    TR_ASSERT(t, resultSummaryIn.durationSec == resultSummaryOut.durationSec);


    return kTR_Pass;
}